

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty_file(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop_00;
  undefined8 uVar3;
  undefined1 local_700 [4];
  int fd;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_tty_t tty;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&tty.orig_termios.c_ospeed);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
            0x165,"0 == uv_loop_init(&loop)");
    abort();
  }
  iVar1 = open64("test/fixtures/empty_file",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if (iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x169,"UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)");
      abort();
    }
    iVar2 = close(iVar1);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x16a,"0 == close(fd)");
      abort();
    }
    iVar1 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x16c,"UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)");
      abort();
    }
  }
  iVar1 = open64("/dev/random",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if (iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x173,"UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)");
      abort();
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x174,"0 == close(fd)");
      abort();
    }
  }
  iVar1 = open64("/dev/zero",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if (iVar2 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x17a,"UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1)");
      abort();
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x17b,"0 == close(fd)");
      abort();
    }
  }
  iVar1 = open64("/dev/tty",2);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_ro.orig_termios.c_ospeed,iVar1,1);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x180,"0 == uv_tty_init(&loop, &tty, fd, 1)");
      abort();
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x181,"0 == close(fd)");
      abort();
    }
    iVar1 = uv_is_readable(&tty_ro.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x182,"uv_is_readable((uv_stream_t*) &tty)");
      abort();
    }
    iVar1 = uv_is_writable(&tty_ro.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x183,"uv_is_writable((uv_stream_t*) &tty)");
      abort();
    }
    uv_close(&tty_ro.orig_termios.c_ospeed);
    iVar1 = uv_is_readable(&tty_ro.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x185,"!uv_is_readable((uv_stream_t*) &tty)");
      abort();
    }
    iVar1 = uv_is_writable(&tty_ro.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x186,"!uv_is_writable((uv_stream_t*) &tty)");
      abort();
    }
  }
  iVar1 = open64("/dev/tty",0);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,&tty_wo.orig_termios.c_ospeed,iVar1,1);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x18b,"0 == uv_tty_init(&loop, &tty_ro, fd, 1)");
      abort();
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x18c,"0 == close(fd)");
      abort();
    }
    iVar1 = uv_is_readable(&tty_wo.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x18d,"uv_is_readable((uv_stream_t*) &tty_ro)");
      abort();
    }
    iVar1 = uv_is_writable(&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x18e,"!uv_is_writable((uv_stream_t*) &tty_ro)");
      abort();
    }
    uv_close(&tty_wo.orig_termios.c_ospeed,0);
    iVar1 = uv_is_readable(&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,400,"!uv_is_readable((uv_stream_t*) &tty_ro)");
      abort();
    }
    iVar1 = uv_is_writable(&tty_wo.orig_termios.c_ospeed);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x191,"!uv_is_writable((uv_stream_t*) &tty_ro)");
      abort();
    }
  }
  iVar1 = open64("/dev/tty",1);
  if (iVar1 != -1) {
    iVar2 = uv_tty_init(&tty.orig_termios.c_ospeed,local_700,iVar1,0);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x196,"0 == uv_tty_init(&loop, &tty_wo, fd, 0)");
      abort();
    }
    iVar1 = close(iVar1);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x197,"0 == close(fd)");
      abort();
    }
    iVar1 = uv_is_readable(local_700);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x198,"!uv_is_readable((uv_stream_t*) &tty_wo)");
      abort();
    }
    iVar1 = uv_is_writable(local_700);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x199,"uv_is_writable((uv_stream_t*) &tty_wo)");
      abort();
    }
    uv_close(local_700,0);
    iVar1 = uv_is_readable(local_700);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x19b,"!uv_is_readable((uv_stream_t*) &tty_wo)");
      abort();
    }
    iVar1 = uv_is_writable(local_700);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c"
              ,0x19c,"!uv_is_writable((uv_stream_t*) &tty_wo)");
      abort();
    }
  }
  iVar1 = uv_run(&tty.orig_termios.c_ospeed,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
            0x1a0,"0 == uv_run(&loop, UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_loop_close(&tty.orig_termios.c_ospeed);
  if (iVar1 == 0) {
    loop_00 = (uv_loop_t *)uv_default_loop();
    close_loop(loop_00);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
            0x1a3,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tty.c",
          0x1a1,"0 == uv_loop_close(&loop)");
  abort();
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT(0 == uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
    /* test EBADF handling */
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT(UV_EINVAL == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT(0 == uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT(0 == close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}